

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::resize(SmallVector<wasm::Literal,_1UL> *this,size_t newSize)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer this_00;
  
  this->usedFixed = (ulong)(newSize != 0);
  if (newSize < 2) {
    pLVar1 = (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = pLVar1;
    if (pLVar2 != pLVar1) {
      do {
        Literal::~Literal(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pLVar2);
      (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar1;
    }
    return;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize(&this->flexible,newSize - 1);
  return;
}

Assistant:

void resize(size_t newSize) {
    usedFixed = std::min(N, newSize);
    if (newSize > N) {
      flexible.resize(newSize - N);
    } else {
      flexible.clear();
    }
  }